

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::TextureSwizzle::IntialStateTest::iterate(IntialStateTest *this)

{
  GLenum texture_target;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x910);
  lVar4 = 0x28;
  do {
    texture_target = *(GLenum *)(texture_targets + lVar4);
    (**(code **)(lVar3 + 0xb8))(texture_target,this->m_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x917);
    verifyValues(this,texture_target);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x1d8);
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult IntialStateTest::iterate()
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	for (size_t tex_tgt_idx = 0; tex_tgt_idx < n_texture_targets; ++tex_tgt_idx)
	{
		const glw::GLenum target = texture_targets[tex_tgt_idx].m_target;

		gl.bindTexture(target, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		verifyValues(target);

		deinit();
	}

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}